

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_privkey_negate(secp256k1_context *ctx,uchar *seckey)

{
  secp256k1_scalar sec;
  
  secp256k1_scalar_set_b32(&sec,seckey,(int *)0x0);
  secp256k1_scalar_negate(&sec,&sec);
  secp256k1_scalar_get_b32(seckey,&sec);
  return 1;
}

Assistant:

int secp256k1_ec_privkey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, NULL);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    return 1;
}